

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1029e4::DiskInterfaceTestStatExistingFile::~DiskInterfaceTestStatExistingFile
          (DiskInterfaceTestStatExistingFile *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_DiskInterfaceTest).super_Test._vptr_Test =
       (_func_int **)&PTR__DiskInterfaceTest_001f8fe0;
  pcVar2 = (this->super_DiskInterfaceTest).temp_dir_.temp_dir_name_._M_dataplus._M_p;
  paVar1 = &(this->super_DiskInterfaceTest).temp_dir_.temp_dir_name_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  pcVar2 = (this->super_DiskInterfaceTest).temp_dir_.start_dir_._M_dataplus._M_p;
  paVar1 = &(this->super_DiskInterfaceTest).temp_dir_.start_dir_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x58);
  return;
}

Assistant:

TEST_F(DiskInterfaceTest, StatExistingFile) {
  string err;
  ASSERT_TRUE(Touch("file"));
  EXPECT_GT(disk_.Stat("file", &err), 1);
  EXPECT_EQ("", err);
}